

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineLayoutVk.cpp
# Opt level: O3

void __thiscall
Diligent::PipelineLayoutVk::Create
          (PipelineLayoutVk *this,RenderDeviceVkImpl *pDeviceVk,
          RefCntAutoPtr<Diligent::PipelineResourceSignatureVkImpl> *ppSignatures,
          Uint32 SignatureCount)

{
  byte bVar1;
  PipelineResourceSignatureVkImpl *pPVar2;
  VulkanPhysicalDevice *pVVar3;
  uint uVar4;
  char (*Args_1) [50];
  uint uVar5;
  uint uVar6;
  long lVar7;
  VkDescriptorSetLayout_T *in_R8;
  ulong uVar8;
  uint uVar9;
  Uint32 DescSetLayoutCount;
  Uint32 DynamicStorageBufferCount;
  Uint32 DynamicUniformBufferCount;
  string msg_1;
  array<VkDescriptorSetLayout_T_*,_16UL> DescSetLayouts;
  PipelineLayoutWrapper local_48;
  
  if ((this->m_DescrSetCount != '\0') ||
     ((this->m_VkPipelineLayout).m_VkObject != (VkPipelineLayout_T *)0x0)) {
    FormatString<char[44]>
              ((string *)&DescSetLayouts,
               (char (*) [44])"This pipeline layout is already initialized");
    DebugAssertionFailed
              ((Char *)DescSetLayouts._M_elems[0],"Create",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/PipelineLayoutVk.cpp"
               ,0x40);
    if (DescSetLayouts._M_elems[0] != (VkDescriptorSetLayout_T *)(DescSetLayouts._M_elems + 2)) {
      operator_delete(DescSetLayouts._M_elems[0],(ulong)(DescSetLayouts._M_elems[2] + 1));
    }
  }
  uVar9 = 0;
  DescSetLayoutCount = 0;
  DynamicUniformBufferCount = 0;
  DynamicStorageBufferCount = 0;
  if (SignatureCount != 0) {
    uVar6 = 0;
    uVar4 = 0;
    Args_1 = (char (*) [50])0x0;
    uVar8 = 0;
    do {
      if (ppSignatures[uVar8].m_pObject != (PipelineResourceSignatureVkImpl *)0x0) {
        if (0xff < (uint)Args_1) {
          FormatString<char[30],unsigned_int,char[42]>
                    (&msg_1,(Diligent *)"Descriptor set layout count (",
                     (char (*) [30])&DescSetLayoutCount,
                     (uint *)") exceeds the maximum representable value",(char (*) [42])in_R8);
          DebugAssertionFailed
                    (msg_1._M_dataplus._M_p,"Create",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/PipelineLayoutVk.cpp"
                     ,0x50);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)msg_1._M_dataplus._M_p != &msg_1.field_2) {
            operator_delete(msg_1._M_dataplus._M_p,msg_1.field_2._M_allocated_capacity + 1);
          }
          Args_1 = (char (*) [50])(ulong)DescSetLayoutCount;
          uVar4 = DescSetLayoutCount;
        }
        (this->m_FirstDescrSetIndex)._M_elems[uVar8] = (uchar)Args_1;
        msg_1._M_dataplus._M_p = (pointer)0x0;
        msg_1._M_string_length = 1;
        pPVar2 = ppSignatures[uVar8].m_pObject;
        lVar7 = 0;
        Args_1 = (char (*) [50])(ulong)uVar4;
        do {
          in_R8 = (pPVar2->m_VkDescrSetLayouts)._M_elems
                  [*(long *)((long)&msg_1._M_dataplus._M_p + lVar7)].m_VkObject;
          if (in_R8 != (VkDescriptorSetLayout_T *)0x0) {
            uVar4 = (int)Args_1 + 1;
            DescSetLayouts._M_elems[(long)Args_1] = in_R8;
            Args_1 = (char (*) [50])(ulong)uVar4;
            DescSetLayoutCount = uVar4;
          }
          lVar7 = lVar7 + 8;
        } while (lVar7 != 0x10);
        uVar6 = uVar6 + pPVar2->m_DynamicUniformBufferCount;
        uVar9 = uVar9 + pPVar2->m_DynamicStorageBufferCount;
        bVar1 = (pPVar2->super_PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>).
                super_DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineResourceSignatureDesc>
                .m_Desc.BindingIndex;
        uVar5 = (uint)bVar1;
        if ((uint)bVar1 < this->m_DbgMaxBindIndex) {
          uVar5 = this->m_DbgMaxBindIndex;
        }
        this->m_DbgMaxBindIndex = uVar5;
        DynamicStorageBufferCount = uVar9;
        DynamicUniformBufferCount = uVar6;
      }
      uVar8 = uVar8 + 1;
    } while (uVar8 != SignatureCount);
    if (0x10 < uVar4) {
      FormatString<char[26],char[50]>
                (&msg_1,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])"DescSetLayoutCount <= MAX_RESOURCE_SIGNATURES * 2",Args_1);
      DebugAssertionFailed
                (msg_1._M_dataplus._M_p,"Create",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/PipelineLayoutVk.cpp"
                 ,0x5f);
      uVar4 = DescSetLayoutCount;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)msg_1._M_dataplus._M_p != &msg_1.field_2) {
        operator_delete(msg_1._M_dataplus._M_p,msg_1.field_2._M_allocated_capacity + 1);
        uVar4 = DescSetLayoutCount;
      }
    }
    pVVar3 = (pDeviceVk->m_PhysicalDevice)._M_t.
             super___uniq_ptr_impl<VulkanUtilities::VulkanPhysicalDevice,_std::default_delete<VulkanUtilities::VulkanPhysicalDevice>_>
             ._M_t.
             super__Tuple_impl<0UL,_VulkanUtilities::VulkanPhysicalDevice_*,_std::default_delete<VulkanUtilities::VulkanPhysicalDevice>_>
             .super__Head_base<0UL,_VulkanUtilities::VulkanPhysicalDevice_*,_false>._M_head_impl;
    if (*(uint32_t *)((long)&(pVVar3->m_Properties).limits + 0x40) < uVar4) {
      LogError<true,char[38],unsigned_int,char[53],unsigned_int,char[2]>
                (false,"Create",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/PipelineLayoutVk.cpp"
                 ,0x65,(char (*) [38])"The total number of descriptor sets (",&DescSetLayoutCount,
                 (char (*) [53])") used by the pipeline layout exceeds device limit (",
                 (uint32_t *)((long)&(pVVar3->m_Properties).limits + 0x40),(char (*) [2])0x920060);
    }
    if (*(uint32_t *)((long)&(pVVar3->m_Properties).limits + 0x68) < uVar6) {
      LogError<true,char[41],unsigned_int,char[53],unsigned_int,char[2]>
                (false,"Create",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/PipelineLayoutVk.cpp"
                 ,0x6b,(char (*) [41])"The number of dynamic uniform buffers  (",
                 &DynamicUniformBufferCount,
                 (char (*) [53])") used by the pipeline layout exceeds device limit (",
                 (uint32_t *)((long)&(pVVar3->m_Properties).limits + 0x68),(char (*) [2])0x920060);
    }
    if (*(uint32_t *)((long)&(pVVar3->m_Properties).limits + 0x70) < uVar9) {
      LogError<true,char[40],unsigned_int,char[53],unsigned_int,char[2]>
                (false,"Create",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/PipelineLayoutVk.cpp"
                 ,0x71,(char (*) [40])"The number of dynamic storage buffers (",
                 &DynamicStorageBufferCount,
                 (char (*) [53])") used by the pipeline layout exceeds device limit (",
                 (uint32_t *)((long)&(pVVar3->m_Properties).limits + 0x70),(char (*) [2])0x920060);
    }
  }
  msg_1._M_string_length = 0;
  msg_1._M_dataplus._M_p = (pointer)0x1e;
  msg_1.field_2._M_allocated_capacity = (ulong)DescSetLayoutCount << 0x20;
  msg_1.field_2._8_8_ = &DescSetLayouts;
  if (DescSetLayoutCount == 0) {
    msg_1.field_2._8_8_ = (array<VkDescriptorSetLayout_T_*,_16UL> *)0x0;
  }
  VulkanUtilities::VulkanLogicalDevice::CreatePipelineLayout
            (&local_48,
             (pDeviceVk->m_LogicalVkDevice).
             super___shared_ptr<VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr,(VkPipelineLayoutCreateInfo *)&msg_1,"");
  VulkanUtilities::
  VulkanObjectWrapper<VkPipelineLayout_T_*,_(VulkanUtilities::VulkanHandleTypeId)11>::operator=
            (&this->m_VkPipelineLayout,&local_48);
  VulkanUtilities::
  VulkanObjectWrapper<VkPipelineLayout_T_*,_(VulkanUtilities::VulkanHandleTypeId)11>::
  ~VulkanObjectWrapper(&local_48);
  this->m_DescrSetCount = (Uint8)DescSetLayoutCount;
  return;
}

Assistant:

void PipelineLayoutVk::Create(RenderDeviceVkImpl* pDeviceVk, RefCntAutoPtr<PipelineResourceSignatureVkImpl> ppSignatures[], Uint32 SignatureCount) noexcept(false)
{
    VERIFY(m_DescrSetCount == 0 && !m_VkPipelineLayout, "This pipeline layout is already initialized");

    std::array<VkDescriptorSetLayout, MAX_RESOURCE_SIGNATURES * PipelineResourceSignatureVkImpl::MAX_DESCRIPTOR_SETS> DescSetLayouts;

    Uint32 DescSetLayoutCount        = 0;
    Uint32 DynamicUniformBufferCount = 0;
    Uint32 DynamicStorageBufferCount = 0;

    for (Uint32 BindInd = 0; BindInd < SignatureCount; ++BindInd)
    {
        // Signatures are arranged by binding index by PipelineStateBase::CopyResourceSignatures
        const auto& pSignature = ppSignatures[BindInd];
        if (pSignature == nullptr)
            continue;

        VERIFY(DescSetLayoutCount <= std::numeric_limits<FirstDescrSetIndexArrayType::value_type>::max(),
               "Descriptor set layout count (", DescSetLayoutCount, ") exceeds the maximum representable value");
        m_FirstDescrSetIndex[BindInd] = static_cast<FirstDescrSetIndexArrayType::value_type>(DescSetLayoutCount);

        for (auto SetId : {PipelineResourceSignatureVkImpl::DESCRIPTOR_SET_ID_STATIC_MUTABLE, PipelineResourceSignatureVkImpl::DESCRIPTOR_SET_ID_DYNAMIC})
        {
            if (pSignature->HasDescriptorSet(SetId))
                DescSetLayouts[DescSetLayoutCount++] = pSignature->GetVkDescriptorSetLayout(SetId);
        }

        DynamicUniformBufferCount += pSignature->GetDynamicUniformBufferCount();
        DynamicStorageBufferCount += pSignature->GetDynamicStorageBufferCount();
#ifdef DILIGENT_DEBUG
        m_DbgMaxBindIndex = std::max(m_DbgMaxBindIndex, Uint32{pSignature->GetDesc().BindingIndex});
#endif
    }
    VERIFY_EXPR(DescSetLayoutCount <= MAX_RESOURCE_SIGNATURES * 2);

    const auto& Limits = pDeviceVk->GetPhysicalDevice().GetProperties().limits;
    if (DescSetLayoutCount > Limits.maxBoundDescriptorSets)
    {
        LOG_ERROR_AND_THROW("The total number of descriptor sets (", DescSetLayoutCount,
                            ") used by the pipeline layout exceeds device limit (", Limits.maxBoundDescriptorSets, ")");
    }

    if (DynamicUniformBufferCount > Limits.maxDescriptorSetUniformBuffersDynamic)
    {
        LOG_ERROR_AND_THROW("The number of dynamic uniform buffers  (", DynamicUniformBufferCount,
                            ") used by the pipeline layout exceeds device limit (", Limits.maxDescriptorSetUniformBuffersDynamic, ")");
    }

    if (DynamicStorageBufferCount > Limits.maxDescriptorSetStorageBuffersDynamic)
    {
        LOG_ERROR_AND_THROW("The number of dynamic storage buffers (", DynamicStorageBufferCount,
                            ") used by the pipeline layout exceeds device limit (", Limits.maxDescriptorSetStorageBuffersDynamic, ")");
    }

    VERIFY(m_DescrSetCount <= std::numeric_limits<decltype(m_DescrSetCount)>::max(),
           "Descriptor set count (", DescSetLayoutCount, ") exceeds the maximum representable value");

    VkPipelineLayoutCreateInfo PipelineLayoutCI = {};

    PipelineLayoutCI.sType                  = VK_STRUCTURE_TYPE_PIPELINE_LAYOUT_CREATE_INFO;
    PipelineLayoutCI.pNext                  = nullptr;
    PipelineLayoutCI.flags                  = 0; // reserved for future use
    PipelineLayoutCI.setLayoutCount         = DescSetLayoutCount;
    PipelineLayoutCI.pSetLayouts            = DescSetLayoutCount ? DescSetLayouts.data() : nullptr;
    PipelineLayoutCI.pushConstantRangeCount = 0;
    PipelineLayoutCI.pPushConstantRanges    = nullptr;
    m_VkPipelineLayout                      = pDeviceVk->GetLogicalDevice().CreatePipelineLayout(PipelineLayoutCI);

    m_DescrSetCount = static_cast<Uint8>(DescSetLayoutCount);
}